

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

BuildNode * __thiscall
anon_unknown.dwarf_1352d2::BuildSystemEngineDelegate::lookupNode
          (BuildSystemEngineDelegate *this,StringRef name)

{
  BuildNode *pBVar1;
  StringRef name_00;
  undefined8 uVar2;
  BuildDescription *pBVar3;
  const_iterator cVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  undefined1 isImplicit;
  StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
  SVar7;
  BuildNode *pBVar8;
  undefined1 local_60 [16];
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_50;
  string local_48;
  
  local_50._M_head_impl = (FileSystem *)name.Length;
  local_60._8_8_ = name.Data;
  pBVar3 = getBuildDescription(this);
  cVar4 = llvm::
          StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
          ::find(&pBVar3->nodes,name);
  pBVar3 = getBuildDescription(this);
  SVar7.Ptr = (pBVar3->nodes).super_StringMapImpl.TheTable +
              (pBVar3->nodes).super_StringMapImpl.NumBuckets;
  if (cVar4.
      super_StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
      .Ptr == (StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
               )SVar7.Ptr) {
    llvm::StringRef::str_abi_cxx11_(&local_48,(StringRef *)(local_60 + 8));
    isImplicit = SUB81(SVar7.Ptr,0);
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->dynamicNodes)._M_h,&local_48);
    std::__cxx11::string::_M_dispose();
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      name_00.Length = (size_t)local_50._M_head_impl;
      name_00.Data = (char *)local_60._8_8_;
      BuildSystemImpl::createNode((BuildSystemImpl *)local_60,name_00,(bool)isImplicit);
      pBVar8 = (BuildNode *)local_60._0_8_;
      llvm::StringRef::str_abi_cxx11_(&local_48,(StringRef *)(local_60 + 8));
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->dynamicNodes,&local_48);
      uVar2 = local_60._0_8_;
      local_60._0_8_ = (BuildSystem *)0x0;
      pBVar1 = (pmVar6->_M_t).
               super___uniq_ptr_impl<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::buildsystem::BuildNode_*,_std::default_delete<llbuild::buildsystem::BuildNode>_>
               .super__Head_base<0UL,_llbuild::buildsystem::BuildNode_*,_false>._M_head_impl;
      (pmVar6->_M_t).
      super___uniq_ptr_impl<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
      ._M_t.
      super__Tuple_impl<0UL,_llbuild::buildsystem::BuildNode_*,_std::default_delete<llbuild::buildsystem::BuildNode>_>
      .super__Head_base<0UL,_llbuild::buildsystem::BuildNode_*,_false>._M_head_impl =
           (BuildNode *)uVar2;
      if (pBVar1 != (BuildNode *)0x0) {
        (**(code **)((long)(pBVar1->super_Node)._vptr_Node + 8))();
      }
      std::__cxx11::string::_M_dispose();
      if ((BuildSystem *)local_60._0_8_ != (BuildSystem *)0x0) {
        (**(code **)((long)*(void **)local_60._0_8_ + 8))();
      }
    }
    else {
      pBVar8 = *(BuildNode **)
                ((long)iVar5.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_true>
                       ._M_cur + 0x28);
    }
  }
  else {
    pBVar8 = *(BuildNode **)
              (*(long *)cVar4.
                        super_StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
                        .Ptr + 8);
  }
  return pBVar8;
}

Assistant:

BuildNode *BuildSystemEngineDelegate::lookupNode(StringRef name) {
  // Find the node.
  auto it = getBuildDescription().getNodes().find(name);
  BuildNode* node;
  if (it != getBuildDescription().getNodes().end()) {
    node = static_cast<BuildNode*>(it->second.get());
  } else {
    auto it = dynamicNodes.find(name);
    if (it != dynamicNodes.end()) {
      node = it->second.get();
    } else {
      // Create nodes on the fly for any unknown ones.
      auto nodeOwner = system.createNode(
                                         name, /*isImplicit=*/true);
      node = nodeOwner.get();
      dynamicNodes[name] = std::move(nodeOwner);
    }
  }
  return node;
}